

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

void __thiscall wasm::TypeBuilder::setHeapType(TypeBuilder *this,size_t i,Struct *struct_)

{
  size_t sVar1;
  pointer pIVar2;
  reference this_00;
  HeapTypeInfo local_70;
  Struct *local_20;
  Struct *struct__local;
  size_t i_local;
  TypeBuilder *this_local;
  
  local_20 = struct_;
  struct__local = (Struct *)i;
  i_local = (size_t)this;
  sVar1 = size(this);
  if (sVar1 <= i) {
    __assert_fail("i < size() && \"index out of bounds\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                  ,0x904,"void wasm::TypeBuilder::setHeapType(size_t, const Struct &)");
  }
  pIVar2 = std::unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>::
           operator->(&this->impl);
  this_00 = std::
            vector<wasm::TypeBuilder::Impl::Entry,_std::allocator<wasm::TypeBuilder::Impl::Entry>_>
            ::operator[](&pIVar2->entries,(size_type)struct__local);
  anon_unknown_0::HeapTypeInfo::HeapTypeInfo(&local_70,local_20);
  Impl::Entry::set(this_00,&local_70);
  anon_unknown_0::HeapTypeInfo::~HeapTypeInfo(&local_70);
  return;
}

Assistant:

void TypeBuilder::setHeapType(size_t i, const Struct& struct_) {
  assert(i < size() && "index out of bounds");
  impl->entries[i].set(struct_);
}